

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBase::StoreFindResult(cmFindBase *this,string *value)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  PolicyStatus PVar4;
  ulong uVar5;
  char *pcVar6;
  string_view sVar7;
  char (*local_240) [6];
  string_view local_1b0;
  string_view local_1a0;
  string local_190;
  cmAlphaNum local_170;
  cmAlphaNum local_140;
  string local_110;
  string_view local_f0;
  string_view local_e0;
  cmAlphaNum local_c0;
  cmAlphaNum local_90;
  undefined1 local_60 [8];
  string notFound;
  bool updateNormalVariable;
  bool force;
  string *value_local;
  cmFindBase *this_local;
  
  PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0125,false);
  PVar4 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    if ((this->StoreResultInCache & 1U) == 0) {
      pcVar1 = (this->super_cmFindCommon).Makefile;
      sVar7 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)value)
      ;
      notFound.field_2._8_8_ = sVar7._M_len;
      cmMakefile::AddDefinition(pcVar1,&this->VariableName,sVar7);
      return;
    }
    pcVar1 = (this->super_cmFindCommon).Makefile;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition
              (pcVar1,&this->VariableName,value,pcVar6,this->VariableType,PVar3 == NEW);
    if (PVar4 != NEW) {
      return;
    }
    bVar2 = cmMakefile::IsNormalDefinitionSet
                      ((this->super_cmFindCommon).Makefile,&this->VariableName);
    if (!bVar2) {
      return;
    }
    pcVar1 = (this->super_cmFindCommon).Makefile;
    sVar7 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)value);
    cmMakefile::AddDefinition(pcVar1,&this->VariableName,sVar7);
    return;
  }
  cmAlphaNum::cmAlphaNum(&local_90,&this->VariableName);
  cmAlphaNum::cmAlphaNum(&local_c0,"-NOTFOUND");
  cmStrCat<>((string *)local_60,&local_90,&local_c0);
  if ((this->StoreResultInCache & 1U) == 0) {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    local_f0 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    cmMakefile::AddDefinition(pcVar1,&this->VariableName,local_f0);
  }
  else {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition
              (pcVar1,&this->VariableName,(string *)local_60,pcVar6,this->VariableType,PVar3 == NEW)
    ;
    if (PVar4 == NEW) {
      bVar2 = cmMakefile::IsNormalDefinitionSet
                        ((this->super_cmFindCommon).Makefile,&this->VariableName);
      if (bVar2) {
        pcVar1 = (this->super_cmFindCommon).Makefile;
        local_e0 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
        cmMakefile::AddDefinition(pcVar1,&this->VariableName,local_e0);
      }
    }
  }
  if ((this->Required & 1U) == 0) goto LAB_00866a7c;
  pcVar1 = (this->super_cmFindCommon).Makefile;
  cmAlphaNum::cmAlphaNum(&local_140,"Could not find ");
  cmAlphaNum::cmAlphaNum(&local_170,&this->VariableName);
  bVar2 = std::operator==(&this->FindCommandName,"find_file");
  if (bVar2) {
LAB_00866931:
    local_240 = (char (*) [6])0xe02ac9;
  }
  else {
    bVar2 = std::operator==(&this->FindCommandName,"find_path");
    if (bVar2) goto LAB_00866931;
    local_240 = (char (*) [6])0xe24281;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a0,", ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b0);
  cmJoin(&local_190,&this->Names,local_1a0,local_1b0);
  cmStrCat<char[22],char[6],char[3],std::__cxx11::string>
            (&local_110,&local_140,&local_170,(char (*) [22])" using the following ",local_240,
             (char (*) [3])0xdcec16,&local_190);
  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_190);
  cmSystemTools::SetFatalErrorOccurred();
LAB_00866a7c:
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void cmFindBase::StoreFindResult(const std::string& value)
{
  bool force =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0125) == cmPolicies::NEW;
  bool updateNormalVariable =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) == cmPolicies::NEW;

  if (!value.empty()) {
    if (this->StoreResultInCache) {
      this->Makefile->AddCacheDefinition(this->VariableName, value,
                                         this->VariableDocumentation.c_str(),
                                         this->VariableType, force);
      if (updateNormalVariable &&
          this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
        this->Makefile->AddDefinition(this->VariableName, value);
      }
    } else {
      this->Makefile->AddDefinition(this->VariableName, value);
    }

    return;
  }

  auto notFound = cmStrCat(this->VariableName, "-NOTFOUND");
  if (this->StoreResultInCache) {
    this->Makefile->AddCacheDefinition(this->VariableName, notFound,
                                       this->VariableDocumentation.c_str(),
                                       this->VariableType, force);
    if (updateNormalVariable &&
        this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
      this->Makefile->AddDefinition(this->VariableName, notFound);
    }
  } else {
    this->Makefile->AddDefinition(this->VariableName, notFound);
  }

  if (this->Required) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Could not find ", this->VariableName, " using the following ",
               (this->FindCommandName == "find_file" ||
                    this->FindCommandName == "find_path"
                  ? "files"
                  : "names"),
               ": ", cmJoin(this->Names, ", ")));
    cmSystemTools::SetFatalErrorOccurred();
  }
}